

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O0

dynamic_truth_table *
kitty::binary_operation<kitty::dynamic_truth_table,std::bit_or<void>>
          (dynamic_truth_table *first,dynamic_truth_table *second,bit_or<void> *op)

{
  const_iterator cVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  iterator iVar4;
  dynamic_truth_table *in_RDI;
  dynamic_truth_table result;
  dynamic_truth_table *in_stack_ffffffffffffff58;
  dynamic_truth_table *this;
  
  this = in_RDI;
  dynamic_truth_table::construct(in_stack_ffffffffffffff58);
  cVar1 = dynamic_truth_table::cbegin(in_stack_ffffffffffffff58);
  cVar2 = dynamic_truth_table::cend(in_stack_ffffffffffffff58);
  cVar3 = dynamic_truth_table::cbegin(in_stack_ffffffffffffff58);
  iVar4 = dynamic_truth_table::begin(in_stack_ffffffffffffff58);
  std::
  transform<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::bit_or<void>>
            (cVar1._M_current,cVar2._M_current,cVar3._M_current,iVar4._M_current);
  dynamic_truth_table::mask_bits(this);
  dynamic_truth_table::dynamic_truth_table(this,in_stack_ffffffffffffff58);
  dynamic_truth_table::~dynamic_truth_table((dynamic_truth_table *)0x110a1d);
  return in_RDI;
}

Assistant:

auto binary_operation( const TT& first, const TT& second, Fn&& op )
{
  assert( first.num_vars() == second.num_vars() );

  auto result = first.construct();
  std::transform( first.cbegin(), first.cend(), second.cbegin(), result.begin(), op );
  result.mask_bits();
  return result;
}